

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBalance.c
# Opt level: O0

void Abc_NodeBalancePermute(Abc_Ntk_t *pNtkNew,Vec_Ptr_t *vSuper,int LeftBound)

{
  int iVar1;
  int i_00;
  Abc_Obj_t *p0;
  Abc_Obj_t *Entry;
  Abc_Obj_t *p1;
  Abc_Obj_t *pAVar2;
  int local_40;
  int i;
  int RightBound;
  Abc_Obj_t *pNode3;
  Abc_Obj_t *pNode2;
  Abc_Obj_t *pNode1;
  int LeftBound_local;
  Vec_Ptr_t *vSuper_local;
  Abc_Ntk_t *pNtkNew_local;
  
  iVar1 = Vec_PtrSize(vSuper);
  i_00 = iVar1 + -2;
  if (i_00 < LeftBound) {
    __assert_fail("LeftBound <= RightBound",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcBalance.c"
                  ,0xc6,"void Abc_NodeBalancePermute(Abc_Ntk_t *, Vec_Ptr_t *, int)");
  }
  if (LeftBound != i_00) {
    p0 = (Abc_Obj_t *)Vec_PtrEntry(vSuper,iVar1 + -1);
    Entry = (Abc_Obj_t *)Vec_PtrEntry(vSuper,i_00);
    for (local_40 = i_00; LeftBound <= local_40; local_40 = local_40 + -1) {
      p1 = (Abc_Obj_t *)Vec_PtrEntry(vSuper,local_40);
      pAVar2 = Abc_AigAndLookup((Abc_Aig_t *)pNtkNew->pManFunc,p0,p1);
      if (pAVar2 != (Abc_Obj_t *)0x0) {
        if (p1 == Entry) {
          return;
        }
        Vec_PtrWriteEntry(vSuper,local_40,Entry);
        Vec_PtrWriteEntry(vSuper,i_00,p1);
        return;
      }
    }
  }
  return;
}

Assistant:

void Abc_NodeBalancePermute( Abc_Ntk_t * pNtkNew, Vec_Ptr_t * vSuper, int LeftBound )
{
    Abc_Obj_t * pNode1, * pNode2, * pNode3;
    int RightBound, i;
    // get the right bound
    RightBound = Vec_PtrSize(vSuper) - 2;
    assert( LeftBound <= RightBound );
    if ( LeftBound == RightBound )
        return;
    // get the two last nodes
    pNode1 = (Abc_Obj_t *)Vec_PtrEntry( vSuper, RightBound + 1 );
    pNode2 = (Abc_Obj_t *)Vec_PtrEntry( vSuper, RightBound     );
    // find the first node that can be shared
    for ( i = RightBound; i >= LeftBound; i-- )
    {
        pNode3 = (Abc_Obj_t *)Vec_PtrEntry( vSuper, i );
        if ( Abc_AigAndLookup( (Abc_Aig_t *)pNtkNew->pManFunc, pNode1, pNode3 ) )
        {
            if ( pNode3 == pNode2 )
                return;
            Vec_PtrWriteEntry( vSuper, i,          pNode2 );
            Vec_PtrWriteEntry( vSuper, RightBound, pNode3 );
            return;
        }
    }
/*
    // we did not find the node to share, randomize choice
    {
        int Choice = rand() % (RightBound - LeftBound + 1);
        pNode3 = Vec_PtrEntry( vSuper, LeftBound + Choice );
        if ( pNode3 == pNode2 )
            return;
        Vec_PtrWriteEntry( vSuper, LeftBound + Choice, pNode2 );
        Vec_PtrWriteEntry( vSuper, RightBound,         pNode3 );
    }
*/
}